

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

void __thiscall FileHandlePool::returnResourceToPool(FileHandlePool *this,int index)

{
  bool bVar1;
  ulong in_RAX;
  reference ppPVar2;
  ulong uStack_8;
  bool inverse;
  
  uStack_8 = in_RAX;
  ppPVar2 = std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::at
                      (&this->pool_vector,(long)index);
  if (*ppPVar2 == (value_type)0x0) {
    fwrite("Invalid entry!\n",0xf,1,_stderr);
    return;
  }
  uStack_8 = uStack_8 & 0xffffffffffffff;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&(*ppPVar2)->available,&inverse,true,memory_order_seq_cst);
  if (bVar1) {
    return;
  }
  fwrite("Handles were likely used by another thread!",0x2b,1,_stderr);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                ,0xa3,"void FileHandlePool::returnResourceToPool(int)");
}

Assistant:

void returnResourceToPool(int index) {
        PoolEntry *pe = pool_vector.at(index);
        if (!pe) {
            fprintf(stderr, "Invalid entry!\n");
            return;
        }
        bool inverse = false;
        if (!pe->available.compare_exchange_strong(inverse, true)) {
            fprintf(stderr, "Handles were likely used by another thread!");
            assert(false);
        }
    }